

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_originator.c
# Opt level: O2

void olsrv2_originator_set(netaddr *originator)

{
  netaddr *setting;
  int iStack_8;
  
  if (originator->_type == '\n') {
    setting = &_originator_v6;
    iStack_8 = 10;
  }
  else {
    if (originator->_type != '\x02') {
      return;
    }
    setting = &_originator_v4;
    iStack_8 = 2;
  }
  _set_originator(iStack_8,setting,originator);
  return;
}

Assistant:

void
olsrv2_originator_set(const struct netaddr *originator) {
  if (netaddr_get_address_family(originator) == AF_INET) {
    _set_originator(AF_INET, &_originator_v4, originator);
  }
  else if (netaddr_get_address_family(originator) == AF_INET6) {
    _set_originator(AF_INET6, &_originator_v6, originator);
  }
}